

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O1

int LS_Thing_Destroy(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,
                    int arg4)

{
  bool bVar1;
  AActor *pAVar2;
  AActor *pAVar3;
  int iVar4;
  TThinkerIterator<AActor> iterator;
  FName local_60;
  FName local_5c;
  DAngle local_58;
  DAngle local_50;
  FThinkerIterator local_48;
  
  if (arg2 == 0 && arg0 == 0) {
    P_Massacre();
  }
  else if (arg0 == 0) {
    FThinkerIterator::FThinkerIterator(&local_48,AActor::RegistrationInfo.MyClass,0x80);
    pAVar2 = (AActor *)FThinkerIterator::Next(&local_48);
    if (pAVar2 != (AActor *)0x0) {
      do {
        pAVar3 = (AActor *)FThinkerIterator::Next(&local_48);
        if ((((pAVar2->flags).Value & 4) != 0) &&
           (bVar1 = FTagManager::SectorHasTag(&tagManager,pAVar2->Sector,arg2), bVar1)) {
          iVar4 = 1000000;
          if (arg1 == 0) {
            iVar4 = pAVar2->health;
          }
          local_5c.Index = 0;
          local_50.Degrees = 0.0;
          P_DamageMobj(pAVar2,(AActor *)0x0,it,iVar4,&local_5c,0,&local_50);
        }
        pAVar2 = pAVar3;
      } while (pAVar3 != (AActor *)0x0);
    }
  }
  else {
    for (pAVar2 = AActor::TIDHash[arg0 & 0x7f]; (pAVar2 != (AActor *)0x0 && (pAVar2->tid != arg0));
        pAVar2 = pAVar2->inext) {
    }
    while (pAVar3 = pAVar2, pAVar2 = pAVar3, pAVar3 != (AActor *)0x0) {
      do {
        pAVar2 = pAVar2->inext;
        if (pAVar2 == (AActor *)0x0) break;
      } while (pAVar2->tid != arg0);
      if ((((pAVar3->flags).Value & 4) != 0) &&
         ((arg2 == 0 || (bVar1 = FTagManager::SectorHasTag(&tagManager,pAVar3->Sector,arg2), bVar1))
         )) {
        iVar4 = 1000000;
        if (arg1 == 0) {
          iVar4 = pAVar3->health;
        }
        local_60.Index = 0;
        local_58.Degrees = 0.0;
        P_DamageMobj(pAVar3,(AActor *)0x0,it,iVar4,&local_60,0,&local_58);
      }
    }
  }
  return 1;
}

Assistant:

FUNC(LS_Thing_Destroy)
// Thing_Destroy (tid, extreme, tag)
{
	AActor *actor;

	if (arg0 == 0 && arg2 == 0)
	{
		P_Massacre ();
	}
	else if (arg0 == 0)
	{
		TThinkerIterator<AActor> iterator;
		
		actor = iterator.Next ();
		while (actor)
		{
			AActor *temp = iterator.Next ();
			if (actor->flags & MF_SHOOTABLE && tagManager.SectorHasTag(actor->Sector, arg2))
				P_DamageMobj (actor, NULL, it, arg1 ? TELEFRAG_DAMAGE : actor->health, NAME_None);
			actor = temp;
		}
	}
	else
	{
		FActorIterator iterator (arg0);

		actor = iterator.Next ();
		while (actor)
		{
			AActor *temp = iterator.Next ();
			if (actor->flags & MF_SHOOTABLE && (arg2 == 0 || tagManager.SectorHasTag(actor->Sector, arg2)))
				P_DamageMobj (actor, NULL, it, arg1 ? TELEFRAG_DAMAGE : actor->health, NAME_None);
			actor = temp;
		}
	}
	return true;
}